

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

void linsolve_lower(double *L,int N,double *b,double *x)

{
  int iVar1;
  double *__ptr;
  double *col;
  double local_50;
  double sum;
  double *A;
  double *y;
  int l;
  int c1;
  int j;
  int i;
  double *x_local;
  double *b_local;
  int N_local;
  double *L_local;
  
  __ptr = (double *)malloc((long)N << 3);
  col = (double *)malloc((long)N * 8 * (long)N);
  c1 = 0;
  while( true ) {
    if (N <= c1) {
      *__ptr = *b / *L;
      for (c1 = 1; c1 < N; c1 = c1 + 1) {
        local_50 = 0.0;
        for (l = 0; l < c1; l = l + 1) {
          local_50 = __ptr[l] * L[c1 * N + l] + local_50;
        }
        __ptr[c1] = (b[c1] - local_50) / L[c1 * N + c1];
      }
      mtranspose(L,N,N,col);
      x[N + -1] = __ptr[N + -1] / col[N * N + -1];
      for (c1 = N + -2; -1 < c1; c1 = c1 + -1) {
        local_50 = 0.0;
        iVar1 = c1 * (N + 1);
        y._0_4_ = 0;
        l = c1;
        while (l = l + 1, l < N) {
          y._0_4_ = (int)y + 1;
          local_50 = col[iVar1 + (int)y] * x[l] + local_50;
        }
        x[c1] = (__ptr[c1] - local_50) / col[iVar1];
      }
      free(__ptr);
      free(col);
      return;
    }
    __ptr[c1] = 0.0;
    x[c1] = 0.0;
    if ((L[c1 * N + c1] == 0.0) && (!NAN(L[c1 * N + c1]))) break;
    c1 = c1 + 1;
  }
  printf("The Matrix system does not have a unique solution");
  exit(1);
}

Assistant:

void linsolve_lower(double *L,int N,double *b,double *x) {
	int i,j,c1,l;
	double *y,*A;
	double sum;
	
	y = (double*) malloc(sizeof(double) *N);
	A = (double*) malloc(sizeof(double) *N *N);
	
	for(i = 0; i < N;++i) {
		y[i] = 0.;
		x[i] = 0.;
		if ( L[i*N + i] == 0.) {
			printf("The Matrix system does not have a unique solution");
			exit(1);
		}
		//printf("\n B %d",ipiv[i]);
	}
	
	// Forward Substitution
	
	y[0] = b[0]/L[0];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * L[c1 + j];
		}
		y[i] = (b[i] - sum)/L[c1+i];
	}
	
	mtranspose(L,N,N,A);
	
	//Back Substitution
	
	x[N - 1] = y[N - 1]/A[N * N - 1];
	
	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += A[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / A[c1];
	}
	
	free(y);
	free(A);
}